

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_UnknownExtensions_Test::
~UnknownFieldSetTest_UnknownExtensions_Test(UnknownFieldSetTest_UnknownExtensions_Test *this)

{
  UnknownFieldSetTest_UnknownExtensions_Test *this_local;
  
  ~UnknownFieldSetTest_UnknownExtensions_Test(this);
  operator_delete(this,0x398);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, UnknownExtensions) {
  // Make sure fields are properly parsed to the UnknownFieldSet even when
  // they are declared as extension numbers.

  unittest::TestEmptyMessageWithExtensions message;
  ASSERT_TRUE(message.ParseFromString(all_fields_data_));

  EXPECT_EQ(message.DebugString(), empty_message_.DebugString());
}